

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
mxx::impl::get_displacements<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *counts)

{
  ulong in_RAX;
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int rank;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,counts);
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 != piVar1) {
    iVar3 = 0;
    do {
      iVar2 = *piVar4;
      if (0x7ffffffe < (ulong)((long)iVar3 + (long)iVar2)) {
        MPI_Comm_rank(&ompi_mpi_comm_world,(long)&uStack_38 + 4);
        printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",uStack_38 >> 0x20,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
               ,0x3a,"get_displacements",
               "(std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max()"
              );
        fflush(_stdout);
        MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
        iVar2 = *piVar4;
        piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      *piVar4 = iVar3;
      piVar4 = piVar4 + 1;
      iVar3 = iVar2 + iVar3;
    } while (piVar4 != piVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> get_displacements(const std::vector<index_t>& counts)
{
    // copy and do an exclusive prefix sum
    std::vector<index_t> result(counts);
    // set the total sum to zero
    index_t sum = 0;
    index_t tmp;

    // calculate the exclusive prefix sum
    typename std::vector<index_t>::iterator begin = result.begin();
    while (begin != result.end())
    {
        tmp = sum;
        // assert that the sum will still fit into the index type (MPI default:
        // int)
        MXX_ASSERT((std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max());
        sum += *begin;
        *begin = tmp;
        ++begin;
    }
    return result;
}